

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

bool __thiscall amrex::DeriveList::canDerive(DeriveList *this,string *name)

{
  pointer __s2;
  _List_node_base *p_Var1;
  _List_node_base *__n;
  int iVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  
  p_Var3 = (this->lst).super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  bVar4 = p_Var3 != (_List_node_base *)this;
  if (bVar4) {
    __s2 = (name->_M_dataplus)._M_p;
    p_Var1 = (_List_node_base *)name->_M_string_length;
    do {
      __n = *(_List_node_base **)((long)(p_Var3 + 1) + 8);
      if (__n == p_Var1) {
        if (__n == (_List_node_base *)0x0) {
          return bVar4;
        }
        iVar2 = bcmp(*(void **)&((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                                (p_Var3 + 1))->
                                super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>
                     ,__s2,(size_t)__n);
        if (iVar2 == 0) {
          return bVar4;
        }
      }
      p_Var3 = (((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)&p_Var3->_M_next)->
               super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      bVar4 = p_Var3 != (_List_node_base *)this;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool
DeriveList::canDerive (const std::string& name) const
{
    for (std::list<DeriveRec>::const_iterator li = lst.begin(), End = lst.end();
         li != End;
         ++li)
    {
        if (li->derive_name == name)
            return true;
    }
    return false;
}